

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O0

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileaveZeros_naive_matches_template_::run
          (Test_bitileave_ileaveZeros_naive_matches_template_ *this)

{
  SourceLocation loc;
  SourceLocation loc_00;
  SourceLocation loc_01;
  SourceLocation loc_02;
  SourceLocation loc_03;
  SourceLocation loc_04;
  SourceLocation loc_05;
  SourceLocation loc_06;
  SourceLocation loc_07;
  SourceLocation loc_08;
  SourceLocation loc_09;
  SourceLocation loc_10;
  SourceLocation loc_11;
  SourceLocation loc_12;
  SourceLocation loc_13;
  SourceLocation loc_14;
  SourceLocation loc_15;
  SourceLocation loc_16;
  SourceLocation loc_17;
  bool bVar1;
  uint __b;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_2908;
  undefined1 local_28e3;
  undefined1 local_28e2;
  undefined1 local_28e1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_28e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2860;
  string_view local_2840;
  undefined4 local_282c;
  uint64_t uStack_2828;
  Cmp cmp__18;
  unsigned_long *local_2820;
  uint64_t *tr__18;
  uint64_t **local_2810;
  uint64_t *tl__18;
  char *pcStack_2800;
  undefined8 local_27f8;
  undefined1 local_27eb;
  undefined1 local_27ea;
  undefined1 local_27e9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_27e8;
  undefined1 local_27c3;
  undefined1 local_27c2;
  undefined1 local_27c1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_27c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2740;
  string_view local_2720;
  undefined4 local_270c;
  uint64_t uStack_2708;
  Cmp cmp__17;
  unsigned_long *local_2700;
  uint64_t *tr__17;
  uint64_t **local_26f0;
  uint64_t *tl__17;
  char *pcStack_26e0;
  undefined8 local_26d8;
  undefined1 local_26cb;
  undefined1 local_26ca;
  undefined1 local_26c9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_26c8;
  undefined1 local_26a3;
  undefined1 local_26a2;
  undefined1 local_26a1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_26a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2620;
  string_view local_2600;
  undefined4 local_25ec;
  uint64_t uStack_25e8;
  Cmp cmp__16;
  unsigned_long *local_25e0;
  uint64_t *tr__16;
  uint64_t **local_25d0;
  uint64_t *tl__16;
  char *pcStack_25c0;
  undefined8 local_25b8;
  undefined1 local_25ab;
  undefined1 local_25aa;
  undefined1 local_25a9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_25a8;
  undefined1 local_2583;
  undefined1 local_2582;
  undefined1 local_2581;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_2580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2500;
  string_view local_24e0;
  undefined4 local_24cc;
  uint64_t uStack_24c8;
  Cmp cmp__15;
  unsigned_long *local_24c0;
  uint64_t *tr__15;
  uint64_t **local_24b0;
  uint64_t *tl__15;
  char *pcStack_24a0;
  undefined8 local_2498;
  undefined1 local_248b;
  undefined1 local_248a;
  undefined1 local_2489;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_2488;
  undefined1 local_2463;
  undefined1 local_2462;
  undefined1 local_2461;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_2460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23e0;
  string_view local_23c0;
  undefined4 local_23ac;
  uint64_t uStack_23a8;
  Cmp cmp__14;
  unsigned_long *local_23a0;
  uint64_t *tr__14;
  uint64_t **local_2390;
  uint64_t *tl__14;
  char *pcStack_2380;
  undefined8 local_2378;
  undefined1 local_236b;
  undefined1 local_236a;
  undefined1 local_2369;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_2368;
  undefined1 local_2343;
  undefined1 local_2342;
  undefined1 local_2341;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_2340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22c0;
  string_view local_22a0;
  undefined4 local_228c;
  uint64_t uStack_2288;
  Cmp cmp__13;
  unsigned_long *local_2280;
  uint64_t *tr__13;
  uint64_t **local_2270;
  uint64_t *tl__13;
  char *pcStack_2260;
  undefined8 local_2258;
  undefined1 local_224b;
  undefined1 local_224a;
  undefined1 local_2249;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_2248;
  undefined1 local_2223;
  undefined1 local_2222;
  undefined1 local_2221;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_2220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21a0;
  string_view local_2180;
  undefined4 local_216c;
  uint64_t uStack_2168;
  Cmp cmp__12;
  unsigned_long *local_2160;
  uint64_t *tr__12;
  uint64_t **local_2150;
  uint64_t *tl__12;
  char *pcStack_2140;
  undefined8 local_2138;
  undefined1 local_212b;
  undefined1 local_212a;
  undefined1 local_2129;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_2128;
  undefined1 local_2103;
  undefined1 local_2102;
  undefined1 local_2101;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_2100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2080;
  string_view local_2060;
  undefined4 local_204c;
  uint64_t uStack_2048;
  Cmp cmp__11;
  unsigned_long *local_2040;
  uint64_t *tr__11;
  uint64_t **local_2030;
  uint64_t *tl__11;
  char *pcStack_2020;
  undefined8 local_2018;
  undefined1 local_200b;
  undefined1 local_200a;
  undefined1 local_2009;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_2008;
  undefined1 local_1fe3;
  undefined1 local_1fe2;
  undefined1 local_1fe1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1fe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f60;
  string_view local_1f40;
  undefined4 local_1f2c;
  uint64_t uStack_1f28;
  Cmp cmp__10;
  unsigned_long *local_1f20;
  uint64_t *tr__10;
  uint64_t **local_1f10;
  uint64_t *tl__10;
  char *pcStack_1f00;
  undefined8 local_1ef8;
  undefined1 local_1eeb;
  undefined1 local_1eea;
  undefined1 local_1ee9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1ee8;
  undefined1 local_1ec3;
  undefined1 local_1ec2;
  undefined1 local_1ec1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1ec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e40;
  string_view local_1e20;
  undefined4 local_1e0c;
  uint64_t uStack_1e08;
  Cmp cmp__9;
  unsigned_long *local_1e00;
  uint64_t *tr__9;
  uint64_t **local_1df0;
  uint64_t *tl__9;
  char *pcStack_1de0;
  undefined8 local_1dd8;
  undefined1 local_1dcb;
  undefined1 local_1dca;
  undefined1 local_1dc9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1dc8;
  undefined1 local_1da3;
  undefined1 local_1da2;
  undefined1 local_1da1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1da0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d20;
  string_view local_1d00;
  undefined4 local_1cec;
  uint64_t uStack_1ce8;
  Cmp cmp__8;
  unsigned_long *local_1ce0;
  uint64_t *tr__8;
  uint64_t **local_1cd0;
  uint64_t *tl__8;
  char *pcStack_1cc0;
  undefined8 local_1cb8;
  undefined1 local_1cab;
  undefined1 local_1caa;
  undefined1 local_1ca9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1ca8;
  undefined1 local_1c83;
  undefined1 local_1c82;
  undefined1 local_1c81;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c00;
  string_view local_1be0;
  undefined4 local_1bcc;
  uint64_t uStack_1bc8;
  Cmp cmp__7;
  unsigned_long *local_1bc0;
  uint64_t *tr__7;
  uint64_t **local_1bb0;
  uint64_t *tl__7;
  char *pcStack_1ba0;
  undefined8 local_1b98;
  undefined1 local_1b8b;
  undefined1 local_1b8a;
  undefined1 local_1b89;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1b88;
  undefined1 local_1b63;
  undefined1 local_1b62;
  undefined1 local_1b61;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ae0;
  string_view local_1ac0;
  undefined4 local_1aac;
  uint64_t uStack_1aa8;
  Cmp cmp__6;
  unsigned_long *local_1aa0;
  uint64_t *tr__6;
  uint64_t **local_1a90;
  uint64_t *tl__6;
  char *pcStack_1a80;
  undefined8 local_1a78;
  undefined1 local_1a6b;
  undefined1 local_1a6a;
  undefined1 local_1a69;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1a68;
  undefined1 local_1a43;
  undefined1 local_1a42;
  undefined1 local_1a41;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19c0;
  string_view local_19a0;
  undefined4 local_198c;
  uint64_t uStack_1988;
  Cmp cmp__5;
  unsigned_long *local_1980;
  uint64_t *tr__5;
  uint64_t **local_1970;
  uint64_t *tl__5;
  char *pcStack_1960;
  undefined8 local_1958;
  undefined1 local_194b;
  undefined1 local_194a;
  undefined1 local_1949;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1948;
  undefined1 local_1923;
  undefined1 local_1922;
  undefined1 local_1921;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18a0;
  string_view local_1880;
  undefined4 local_186c;
  uint64_t uStack_1868;
  Cmp cmp__4;
  unsigned_long *local_1860;
  uint64_t *tr__4;
  uint64_t **local_1850;
  uint64_t *tl__4;
  char *pcStack_1840;
  undefined8 local_1838;
  undefined1 local_182b;
  undefined1 local_182a;
  undefined1 local_1829;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1828;
  undefined1 local_1803;
  undefined1 local_1802;
  undefined1 local_1801;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1780;
  string_view local_1760;
  undefined4 local_174c;
  uint64_t uStack_1748;
  Cmp cmp__3;
  unsigned_long *local_1740;
  uint64_t *tr__3;
  uint64_t **local_1730;
  uint64_t *tl__3;
  char *pcStack_1720;
  undefined8 local_1718;
  undefined1 local_170b;
  undefined1 local_170a;
  undefined1 local_1709;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1708;
  undefined1 local_16e3;
  undefined1 local_16e2;
  undefined1 local_16e1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_16e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1660;
  string_view local_1640;
  undefined4 local_162c;
  uint64_t uStack_1628;
  Cmp cmp__2;
  unsigned_long *local_1620;
  uint64_t *tr__2;
  uint64_t **local_1610;
  uint64_t *tl__2;
  char *pcStack_1600;
  undefined8 local_15f8;
  undefined1 local_15eb;
  undefined1 local_15ea;
  undefined1 local_15e9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_15e8;
  undefined1 local_15c3;
  undefined1 local_15c2;
  undefined1 local_15c1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_15c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1540;
  string_view local_1520;
  undefined4 local_150c;
  uint64_t uStack_1508;
  Cmp cmp__1;
  unsigned_long *local_1500;
  uint64_t *tr__1;
  uint64_t **local_14f0;
  uint64_t *tl__1;
  char *pcStack_14e0;
  undefined8 local_14d8;
  undefined1 local_14cb;
  undefined1 local_14ca;
  undefined1 local_14c9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_14c8;
  undefined1 local_14a6;
  undefined1 local_14a5;
  undefined1 local_1491;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_1490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1410;
  string_view local_13f0;
  undefined4 local_13dc;
  uint64_t uStack_13d8;
  Cmp cmp_;
  unsigned_long *local_13d0;
  uint64_t *tr_;
  uint64_t **local_13c0;
  uint64_t *tl_;
  ulong uStack_13b0;
  result_type_conflict input;
  size_t i;
  uniform_int_distribution<unsigned_int> distr;
  mt19937 rng;
  size_t iterations;
  Test_bitileave_ileaveZeros_naive_matches_template_ *this_local;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&distr,0x3039);
  __b = std::numeric_limits<unsigned_int>::max();
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)&i,0,__b);
  uStack_13b0 = 0;
  while( true ) {
    if (0x1fff < uStack_13b0) {
      return;
    }
    tl_._4_4_ = std::uniform_int_distribution<unsigned_int>::operator()
                          ((uniform_int_distribution<unsigned_int> *)&i,
                           (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)&distr);
    tr_ = (uint64_t *)ileaveZeros_const<1u,0u>(tl_._4_4_);
    local_13c0 = &tr_;
    uStack_13d8 = detail::ileaveZeros_naive(tl_._4_4_,1);
    local_13d0 = &stack0xffffffffffffec28;
    local_13dc = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_13c0,local_13d0);
    local_1491 = 0;
    local_14a5 = 0;
    local_14a6 = 0;
    local_14c9 = 0;
    local_14ca = 0;
    local_14cb = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_1490,(unsigned_long *)local_13c0);
      local_1491 = 1;
      std::operator+(&local_1470,
                     "Comparison failed: ileaveZeros_const<1>(input) == detail::ileaveZeros_naive(input, 1) (with \"ileaveZeros_const<1>(input)\"="
                     ,&local_1490);
      local_14a5 = 1;
      std::operator+(&local_1450,&local_1470,", \"detail::ileaveZeros_naive(input, 1)\"=");
      local_14a6 = 1;
      stringify<unsigned_long>(&local_14c8,local_13d0);
      local_14c9 = 1;
      std::operator+(&local_1430,&local_1450,&local_14c8);
      local_14ca = 1;
      std::operator+(&local_1410,&local_1430,")");
      local_14cb = 1;
      local_13f0 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1410);
      tl__1 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_14e0 = "run";
      local_14d8 = 0x90;
      loc.function = "run";
      loc.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc.line = 0x90;
      assertFail(local_13f0,loc);
    }
    local_1491 = 0;
    local_14a5 = 0;
    local_14a6 = 0;
    local_14c9 = 0;
    local_14ca = 0;
    local_14cb = 0;
    tr__1 = (uint64_t *)ileaveZeros_const<2u,0u>(tl_._4_4_);
    local_14f0 = &tr__1;
    uStack_1508 = detail::ileaveZeros_naive(tl_._4_4_,2);
    local_1500 = &stack0xffffffffffffeaf8;
    local_150c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_14f0,local_1500);
    local_15c1 = 0;
    local_15c2 = 0;
    local_15c3 = 0;
    local_15e9 = 0;
    local_15ea = 0;
    local_15eb = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_15c0,(unsigned_long *)local_14f0);
      local_15c1 = 1;
      std::operator+(&local_15a0,
                     "Comparison failed: ileaveZeros_const<2>(input) == detail::ileaveZeros_naive(input, 2) (with \"ileaveZeros_const<2>(input)\"="
                     ,&local_15c0);
      local_15c2 = 1;
      std::operator+(&local_1580,&local_15a0,", \"detail::ileaveZeros_naive(input, 2)\"=");
      local_15c3 = 1;
      stringify<unsigned_long>(&local_15e8,local_1500);
      local_15e9 = 1;
      std::operator+(&local_1560,&local_1580,&local_15e8);
      local_15ea = 1;
      std::operator+(&local_1540,&local_1560,")");
      local_15eb = 1;
      local_1520 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1540);
      tl__2 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_1600 = "run";
      local_15f8 = 0x91;
      loc_00.function = "run";
      loc_00.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_00.line = 0x91;
      assertFail(local_1520,loc_00);
    }
    local_15c1 = 0;
    local_15c2 = 0;
    local_15c3 = 0;
    local_15e9 = 0;
    local_15ea = 0;
    local_15eb = 0;
    tr__2 = (uint64_t *)ileaveZeros_const<3u,0u>(tl_._4_4_);
    local_1610 = &tr__2;
    uStack_1628 = detail::ileaveZeros_naive(tl_._4_4_,3);
    local_1620 = &stack0xffffffffffffe9d8;
    local_162c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_1610,local_1620);
    local_16e1 = 0;
    local_16e2 = 0;
    local_16e3 = 0;
    local_1709 = 0;
    local_170a = 0;
    local_170b = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_16e0,(unsigned_long *)local_1610);
      local_16e1 = 1;
      std::operator+(&local_16c0,
                     "Comparison failed: ileaveZeros_const<3>(input) == detail::ileaveZeros_naive(input, 3) (with \"ileaveZeros_const<3>(input)\"="
                     ,&local_16e0);
      local_16e2 = 1;
      std::operator+(&local_16a0,&local_16c0,", \"detail::ileaveZeros_naive(input, 3)\"=");
      local_16e3 = 1;
      stringify<unsigned_long>(&local_1708,local_1620);
      local_1709 = 1;
      std::operator+(&local_1680,&local_16a0,&local_1708);
      local_170a = 1;
      std::operator+(&local_1660,&local_1680,")");
      local_170b = 1;
      local_1640 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1660);
      tl__3 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_1720 = "run";
      local_1718 = 0x92;
      loc_01.function = "run";
      loc_01.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_01.line = 0x92;
      assertFail(local_1640,loc_01);
    }
    local_16e1 = 0;
    local_16e2 = 0;
    local_16e3 = 0;
    local_1709 = 0;
    local_170a = 0;
    local_170b = 0;
    tr__3 = (uint64_t *)ileaveZeros_const<4u,0u>(tl_._4_4_);
    local_1730 = &tr__3;
    uStack_1748 = detail::ileaveZeros_naive(tl_._4_4_,4);
    local_1740 = &stack0xffffffffffffe8b8;
    local_174c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_1730,local_1740);
    local_1801 = 0;
    local_1802 = 0;
    local_1803 = 0;
    local_1829 = 0;
    local_182a = 0;
    local_182b = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_1800,(unsigned_long *)local_1730);
      local_1801 = 1;
      std::operator+(&local_17e0,
                     "Comparison failed: ileaveZeros_const<4>(input) == detail::ileaveZeros_naive(input, 4) (with \"ileaveZeros_const<4>(input)\"="
                     ,&local_1800);
      local_1802 = 1;
      std::operator+(&local_17c0,&local_17e0,", \"detail::ileaveZeros_naive(input, 4)\"=");
      local_1803 = 1;
      stringify<unsigned_long>(&local_1828,local_1740);
      local_1829 = 1;
      std::operator+(&local_17a0,&local_17c0,&local_1828);
      local_182a = 1;
      std::operator+(&local_1780,&local_17a0,")");
      local_182b = 1;
      local_1760 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1780);
      tl__4 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_1840 = "run";
      local_1838 = 0x93;
      loc_02.function = "run";
      loc_02.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_02.line = 0x93;
      assertFail(local_1760,loc_02);
    }
    local_1801 = 0;
    local_1802 = 0;
    local_1803 = 0;
    local_1829 = 0;
    local_182a = 0;
    local_182b = 0;
    tr__4 = (uint64_t *)ileaveZeros_const<5u,0u>(tl_._4_4_);
    local_1850 = &tr__4;
    uStack_1868 = detail::ileaveZeros_naive(tl_._4_4_,5);
    local_1860 = &stack0xffffffffffffe798;
    local_186c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_1850,local_1860);
    local_1921 = 0;
    local_1922 = 0;
    local_1923 = 0;
    local_1949 = 0;
    local_194a = 0;
    local_194b = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_1920,(unsigned_long *)local_1850);
      local_1921 = 1;
      std::operator+(&local_1900,
                     "Comparison failed: ileaveZeros_const<5>(input) == detail::ileaveZeros_naive(input, 5) (with \"ileaveZeros_const<5>(input)\"="
                     ,&local_1920);
      local_1922 = 1;
      std::operator+(&local_18e0,&local_1900,", \"detail::ileaveZeros_naive(input, 5)\"=");
      local_1923 = 1;
      stringify<unsigned_long>(&local_1948,local_1860);
      local_1949 = 1;
      std::operator+(&local_18c0,&local_18e0,&local_1948);
      local_194a = 1;
      std::operator+(&local_18a0,&local_18c0,")");
      local_194b = 1;
      local_1880 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_18a0);
      tl__5 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_1960 = "run";
      local_1958 = 0x94;
      loc_03.function = "run";
      loc_03.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_03.line = 0x94;
      assertFail(local_1880,loc_03);
    }
    local_1921 = 0;
    local_1922 = 0;
    local_1923 = 0;
    local_1949 = 0;
    local_194a = 0;
    local_194b = 0;
    tr__5 = (uint64_t *)ileaveZeros_const<6u,0u>(tl_._4_4_);
    local_1970 = &tr__5;
    uStack_1988 = detail::ileaveZeros_naive(tl_._4_4_,6);
    local_1980 = &stack0xffffffffffffe678;
    local_198c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_1970,local_1980);
    local_1a41 = 0;
    local_1a42 = 0;
    local_1a43 = 0;
    local_1a69 = 0;
    local_1a6a = 0;
    local_1a6b = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_1a40,(unsigned_long *)local_1970);
      local_1a41 = 1;
      std::operator+(&local_1a20,
                     "Comparison failed: ileaveZeros_const<6>(input) == detail::ileaveZeros_naive(input, 6) (with \"ileaveZeros_const<6>(input)\"="
                     ,&local_1a40);
      local_1a42 = 1;
      std::operator+(&local_1a00,&local_1a20,", \"detail::ileaveZeros_naive(input, 6)\"=");
      local_1a43 = 1;
      stringify<unsigned_long>(&local_1a68,local_1980);
      local_1a69 = 1;
      std::operator+(&local_19e0,&local_1a00,&local_1a68);
      local_1a6a = 1;
      std::operator+(&local_19c0,&local_19e0,")");
      local_1a6b = 1;
      local_19a0 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_19c0);
      tl__6 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_1a80 = "run";
      local_1a78 = 0x95;
      loc_04.function = "run";
      loc_04.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_04.line = 0x95;
      assertFail(local_19a0,loc_04);
    }
    local_1a41 = 0;
    local_1a42 = 0;
    local_1a43 = 0;
    local_1a69 = 0;
    local_1a6a = 0;
    local_1a6b = 0;
    tr__6 = (uint64_t *)ileaveZeros_const<7u,0u>(tl_._4_4_);
    local_1a90 = &tr__6;
    uStack_1aa8 = detail::ileaveZeros_naive(tl_._4_4_,7);
    local_1aa0 = &stack0xffffffffffffe558;
    local_1aac = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_1a90,local_1aa0);
    local_1b61 = 0;
    local_1b62 = 0;
    local_1b63 = 0;
    local_1b89 = 0;
    local_1b8a = 0;
    local_1b8b = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_1b60,(unsigned_long *)local_1a90);
      local_1b61 = 1;
      std::operator+(&local_1b40,
                     "Comparison failed: ileaveZeros_const<7>(input) == detail::ileaveZeros_naive(input, 7) (with \"ileaveZeros_const<7>(input)\"="
                     ,&local_1b60);
      local_1b62 = 1;
      std::operator+(&local_1b20,&local_1b40,", \"detail::ileaveZeros_naive(input, 7)\"=");
      local_1b63 = 1;
      stringify<unsigned_long>(&local_1b88,local_1aa0);
      local_1b89 = 1;
      std::operator+(&local_1b00,&local_1b20,&local_1b88);
      local_1b8a = 1;
      std::operator+(&local_1ae0,&local_1b00,")");
      local_1b8b = 1;
      local_1ac0 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1ae0);
      tl__7 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_1ba0 = "run";
      local_1b98 = 0x96;
      loc_05.function = "run";
      loc_05.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_05.line = 0x96;
      assertFail(local_1ac0,loc_05);
    }
    local_1b61 = 0;
    local_1b62 = 0;
    local_1b63 = 0;
    local_1b89 = 0;
    local_1b8a = 0;
    local_1b8b = 0;
    tr__7 = (uint64_t *)ileaveZeros_const<8u,0u>(tl_._4_4_);
    local_1bb0 = &tr__7;
    uStack_1bc8 = detail::ileaveZeros_naive(tl_._4_4_,8);
    local_1bc0 = &stack0xffffffffffffe438;
    local_1bcc = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_1bb0,local_1bc0);
    local_1c81 = 0;
    local_1c82 = 0;
    local_1c83 = 0;
    local_1ca9 = 0;
    local_1caa = 0;
    local_1cab = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_1c80,(unsigned_long *)local_1bb0);
      local_1c81 = 1;
      std::operator+(&local_1c60,
                     "Comparison failed: ileaveZeros_const<8>(input) == detail::ileaveZeros_naive(input, 8) (with \"ileaveZeros_const<8>(input)\"="
                     ,&local_1c80);
      local_1c82 = 1;
      std::operator+(&local_1c40,&local_1c60,", \"detail::ileaveZeros_naive(input, 8)\"=");
      local_1c83 = 1;
      stringify<unsigned_long>(&local_1ca8,local_1bc0);
      local_1ca9 = 1;
      std::operator+(&local_1c20,&local_1c40,&local_1ca8);
      local_1caa = 1;
      std::operator+(&local_1c00,&local_1c20,")");
      local_1cab = 1;
      local_1be0 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1c00);
      tl__8 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_1cc0 = "run";
      local_1cb8 = 0x97;
      loc_06.function = "run";
      loc_06.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_06.line = 0x97;
      assertFail(local_1be0,loc_06);
    }
    local_1c81 = 0;
    local_1c82 = 0;
    local_1c83 = 0;
    local_1ca9 = 0;
    local_1caa = 0;
    local_1cab = 0;
    tr__8 = (uint64_t *)ileaveZeros_const<9u,0u>(tl_._4_4_);
    local_1cd0 = &tr__8;
    uStack_1ce8 = detail::ileaveZeros_naive(tl_._4_4_,9);
    local_1ce0 = &stack0xffffffffffffe318;
    local_1cec = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_1cd0,local_1ce0);
    local_1da1 = 0;
    local_1da2 = 0;
    local_1da3 = 0;
    local_1dc9 = 0;
    local_1dca = 0;
    local_1dcb = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_1da0,(unsigned_long *)local_1cd0);
      local_1da1 = 1;
      std::operator+(&local_1d80,
                     "Comparison failed: ileaveZeros_const<9>(input) == detail::ileaveZeros_naive(input, 9) (with \"ileaveZeros_const<9>(input)\"="
                     ,&local_1da0);
      local_1da2 = 1;
      std::operator+(&local_1d60,&local_1d80,", \"detail::ileaveZeros_naive(input, 9)\"=");
      local_1da3 = 1;
      stringify<unsigned_long>(&local_1dc8,local_1ce0);
      local_1dc9 = 1;
      std::operator+(&local_1d40,&local_1d60,&local_1dc8);
      local_1dca = 1;
      std::operator+(&local_1d20,&local_1d40,")");
      local_1dcb = 1;
      local_1d00 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1d20);
      tl__9 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_1de0 = "run";
      local_1dd8 = 0x98;
      loc_07.function = "run";
      loc_07.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_07.line = 0x98;
      assertFail(local_1d00,loc_07);
    }
    local_1da1 = 0;
    local_1da2 = 0;
    local_1da3 = 0;
    local_1dc9 = 0;
    local_1dca = 0;
    local_1dcb = 0;
    tr__9 = (uint64_t *)ileaveZeros_const<10u,0u>(tl_._4_4_);
    local_1df0 = &tr__9;
    uStack_1e08 = detail::ileaveZeros_naive(tl_._4_4_,10);
    local_1e00 = &stack0xffffffffffffe1f8;
    local_1e0c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_1df0,local_1e00);
    local_1ec1 = 0;
    local_1ec2 = 0;
    local_1ec3 = 0;
    local_1ee9 = 0;
    local_1eea = 0;
    local_1eeb = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_1ec0,(unsigned_long *)local_1df0);
      local_1ec1 = 1;
      std::operator+(&local_1ea0,
                     "Comparison failed: ileaveZeros_const<10>(input) == detail::ileaveZeros_naive(input, 10) (with \"ileaveZeros_const<10>(input)\"="
                     ,&local_1ec0);
      local_1ec2 = 1;
      std::operator+(&local_1e80,&local_1ea0,", \"detail::ileaveZeros_naive(input, 10)\"=");
      local_1ec3 = 1;
      stringify<unsigned_long>(&local_1ee8,local_1e00);
      local_1ee9 = 1;
      std::operator+(&local_1e60,&local_1e80,&local_1ee8);
      local_1eea = 1;
      std::operator+(&local_1e40,&local_1e60,")");
      local_1eeb = 1;
      local_1e20 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1e40);
      tl__10 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_1f00 = "run";
      local_1ef8 = 0x99;
      loc_08.function = "run";
      loc_08.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_08.line = 0x99;
      assertFail(local_1e20,loc_08);
    }
    local_1ec1 = 0;
    local_1ec2 = 0;
    local_1ec3 = 0;
    local_1ee9 = 0;
    local_1eea = 0;
    local_1eeb = 0;
    tr__10 = (uint64_t *)ileaveZeros_const<11u,0u>(tl_._4_4_);
    local_1f10 = &tr__10;
    uStack_1f28 = detail::ileaveZeros_naive(tl_._4_4_,0xb);
    local_1f20 = &stack0xffffffffffffe0d8;
    local_1f2c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_1f10,local_1f20);
    local_1fe1 = 0;
    local_1fe2 = 0;
    local_1fe3 = 0;
    local_2009 = 0;
    local_200a = 0;
    local_200b = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_1fe0,(unsigned_long *)local_1f10);
      local_1fe1 = 1;
      std::operator+(&local_1fc0,
                     "Comparison failed: ileaveZeros_const<11>(input) == detail::ileaveZeros_naive(input, 11) (with \"ileaveZeros_const<11>(input)\"="
                     ,&local_1fe0);
      local_1fe2 = 1;
      std::operator+(&local_1fa0,&local_1fc0,", \"detail::ileaveZeros_naive(input, 11)\"=");
      local_1fe3 = 1;
      stringify<unsigned_long>(&local_2008,local_1f20);
      local_2009 = 1;
      std::operator+(&local_1f80,&local_1fa0,&local_2008);
      local_200a = 1;
      std::operator+(&local_1f60,&local_1f80,")");
      local_200b = 1;
      local_1f40 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1f60);
      tl__11 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_2020 = "run";
      local_2018 = 0x9a;
      loc_09.function = "run";
      loc_09.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_09.line = 0x9a;
      assertFail(local_1f40,loc_09);
    }
    local_1fe1 = 0;
    local_1fe2 = 0;
    local_1fe3 = 0;
    local_2009 = 0;
    local_200a = 0;
    local_200b = 0;
    tr__11 = (uint64_t *)ileaveZeros_const<12u,0u>(tl_._4_4_);
    local_2030 = &tr__11;
    uStack_2048 = detail::ileaveZeros_naive(tl_._4_4_,0xc);
    local_2040 = &stack0xffffffffffffdfb8;
    local_204c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_2030,local_2040);
    local_2101 = 0;
    local_2102 = 0;
    local_2103 = 0;
    local_2129 = 0;
    local_212a = 0;
    local_212b = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_2100,(unsigned_long *)local_2030);
      local_2101 = 1;
      std::operator+(&local_20e0,
                     "Comparison failed: ileaveZeros_const<12>(input) == detail::ileaveZeros_naive(input, 12) (with \"ileaveZeros_const<12>(input)\"="
                     ,&local_2100);
      local_2102 = 1;
      std::operator+(&local_20c0,&local_20e0,", \"detail::ileaveZeros_naive(input, 12)\"=");
      local_2103 = 1;
      stringify<unsigned_long>(&local_2128,local_2040);
      local_2129 = 1;
      std::operator+(&local_20a0,&local_20c0,&local_2128);
      local_212a = 1;
      std::operator+(&local_2080,&local_20a0,")");
      local_212b = 1;
      local_2060 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2080);
      tl__12 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_2140 = "run";
      local_2138 = 0x9b;
      loc_10.function = "run";
      loc_10.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_10.line = 0x9b;
      assertFail(local_2060,loc_10);
    }
    local_2101 = 0;
    local_2102 = 0;
    local_2103 = 0;
    local_2129 = 0;
    local_212a = 0;
    local_212b = 0;
    tr__12 = (uint64_t *)ileaveZeros_const<13u,0u>(tl_._4_4_);
    local_2150 = &tr__12;
    uStack_2168 = detail::ileaveZeros_naive(tl_._4_4_,0xd);
    local_2160 = &stack0xffffffffffffde98;
    local_216c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_2150,local_2160);
    local_2221 = 0;
    local_2222 = 0;
    local_2223 = 0;
    local_2249 = 0;
    local_224a = 0;
    local_224b = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_2220,(unsigned_long *)local_2150);
      local_2221 = 1;
      std::operator+(&local_2200,
                     "Comparison failed: ileaveZeros_const<13>(input) == detail::ileaveZeros_naive(input, 13) (with \"ileaveZeros_const<13>(input)\"="
                     ,&local_2220);
      local_2222 = 1;
      std::operator+(&local_21e0,&local_2200,", \"detail::ileaveZeros_naive(input, 13)\"=");
      local_2223 = 1;
      stringify<unsigned_long>(&local_2248,local_2160);
      local_2249 = 1;
      std::operator+(&local_21c0,&local_21e0,&local_2248);
      local_224a = 1;
      std::operator+(&local_21a0,&local_21c0,")");
      local_224b = 1;
      local_2180 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_21a0);
      tl__13 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_2260 = "run";
      local_2258 = 0x9c;
      loc_11.function = "run";
      loc_11.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_11.line = 0x9c;
      assertFail(local_2180,loc_11);
    }
    local_2221 = 0;
    local_2222 = 0;
    local_2223 = 0;
    local_2249 = 0;
    local_224a = 0;
    local_224b = 0;
    tr__13 = (uint64_t *)ileaveZeros_const<14u,0u>(tl_._4_4_);
    local_2270 = &tr__13;
    uStack_2288 = detail::ileaveZeros_naive(tl_._4_4_,0xe);
    local_2280 = &stack0xffffffffffffdd78;
    local_228c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_2270,local_2280);
    local_2341 = 0;
    local_2342 = 0;
    local_2343 = 0;
    local_2369 = 0;
    local_236a = 0;
    local_236b = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_2340,(unsigned_long *)local_2270);
      local_2341 = 1;
      std::operator+(&local_2320,
                     "Comparison failed: ileaveZeros_const<14>(input) == detail::ileaveZeros_naive(input, 14) (with \"ileaveZeros_const<14>(input)\"="
                     ,&local_2340);
      local_2342 = 1;
      std::operator+(&local_2300,&local_2320,", \"detail::ileaveZeros_naive(input, 14)\"=");
      local_2343 = 1;
      stringify<unsigned_long>(&local_2368,local_2280);
      local_2369 = 1;
      std::operator+(&local_22e0,&local_2300,&local_2368);
      local_236a = 1;
      std::operator+(&local_22c0,&local_22e0,")");
      local_236b = 1;
      local_22a0 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_22c0);
      tl__14 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_2380 = "run";
      local_2378 = 0x9d;
      loc_12.function = "run";
      loc_12.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_12.line = 0x9d;
      assertFail(local_22a0,loc_12);
    }
    local_2341 = 0;
    local_2342 = 0;
    local_2343 = 0;
    local_2369 = 0;
    local_236a = 0;
    local_236b = 0;
    tr__14 = (uint64_t *)ileaveZeros_const<15u,0u>(tl_._4_4_);
    local_2390 = &tr__14;
    uStack_23a8 = detail::ileaveZeros_naive(tl_._4_4_,0xf);
    local_23a0 = &stack0xffffffffffffdc58;
    local_23ac = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_2390,local_23a0);
    local_2461 = 0;
    local_2462 = 0;
    local_2463 = 0;
    local_2489 = 0;
    local_248a = 0;
    local_248b = 0;
    if (!bVar1) break;
    local_2461 = 0;
    local_2462 = 0;
    local_2463 = 0;
    local_2489 = 0;
    local_248a = 0;
    local_248b = 0;
    tr__15 = (uint64_t *)ileaveZeros_const<16u,0u>(tl_._4_4_);
    local_24b0 = &tr__15;
    uStack_24c8 = detail::ileaveZeros_naive(tl_._4_4_,0x10);
    local_24c0 = &stack0xffffffffffffdb38;
    local_24cc = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_24b0,local_24c0);
    local_2581 = 0;
    local_2582 = 0;
    local_2583 = 0;
    local_25a9 = 0;
    local_25aa = 0;
    local_25ab = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_2580,(unsigned_long *)local_24b0);
      local_2581 = 1;
      std::operator+(&local_2560,
                     "Comparison failed: ileaveZeros_const<16>(input) == detail::ileaveZeros_naive(input, 16) (with \"ileaveZeros_const<16>(input)\"="
                     ,&local_2580);
      local_2582 = 1;
      std::operator+(&local_2540,&local_2560,", \"detail::ileaveZeros_naive(input, 16)\"=");
      local_2583 = 1;
      stringify<unsigned_long>(&local_25a8,local_24c0);
      local_25a9 = 1;
      std::operator+(&local_2520,&local_2540,&local_25a8);
      local_25aa = 1;
      std::operator+(&local_2500,&local_2520,")");
      local_25ab = 1;
      local_24e0 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2500);
      tl__16 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_25c0 = "run";
      local_25b8 = 0x9f;
      loc_14.function = "run";
      loc_14.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_14.line = 0x9f;
      assertFail(local_24e0,loc_14);
    }
    local_2581 = 0;
    local_2582 = 0;
    local_2583 = 0;
    local_25a9 = 0;
    local_25aa = 0;
    local_25ab = 0;
    tr__16 = (uint64_t *)ileaveZeros_const<16u,0u>(tl_._4_4_);
    local_25d0 = &tr__16;
    uStack_25e8 = detail::ileaveZeros_naive(tl_._4_4_,0x10);
    local_25e0 = &stack0xffffffffffffda18;
    local_25ec = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_25d0,local_25e0);
    local_26a1 = 0;
    local_26a2 = 0;
    local_26a3 = 0;
    local_26c9 = 0;
    local_26ca = 0;
    local_26cb = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_26a0,(unsigned_long *)local_25d0);
      local_26a1 = 1;
      std::operator+(&local_2680,
                     "Comparison failed: ileaveZeros_const<16>(input) == detail::ileaveZeros_naive(input, 16) (with \"ileaveZeros_const<16>(input)\"="
                     ,&local_26a0);
      local_26a2 = 1;
      std::operator+(&local_2660,&local_2680,", \"detail::ileaveZeros_naive(input, 16)\"=");
      local_26a3 = 1;
      stringify<unsigned_long>(&local_26c8,local_25e0);
      local_26c9 = 1;
      std::operator+(&local_2640,&local_2660,&local_26c8);
      local_26ca = 1;
      std::operator+(&local_2620,&local_2640,")");
      local_26cb = 1;
      local_2600 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2620);
      tl__17 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_26e0 = "run";
      local_26d8 = 0xa0;
      loc_15.function = "run";
      loc_15.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_15.line = 0xa0;
      assertFail(local_2600,loc_15);
    }
    local_26a1 = 0;
    local_26a2 = 0;
    local_26a3 = 0;
    local_26c9 = 0;
    local_26ca = 0;
    local_26cb = 0;
    tr__17 = (uint64_t *)ileaveZeros_const<32u,0u>(tl_._4_4_);
    local_26f0 = &tr__17;
    uStack_2708 = detail::ileaveZeros_naive(tl_._4_4_,0x20);
    local_2700 = &stack0xffffffffffffd8f8;
    local_270c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_26f0,local_2700);
    local_27c1 = 0;
    local_27c2 = 0;
    local_27c3 = 0;
    local_27e9 = 0;
    local_27ea = 0;
    local_27eb = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_27c0,(unsigned_long *)local_26f0);
      local_27c1 = 1;
      std::operator+(&local_27a0,
                     "Comparison failed: ileaveZeros_const<32>(input) == detail::ileaveZeros_naive(input, 32) (with \"ileaveZeros_const<32>(input)\"="
                     ,&local_27c0);
      local_27c2 = 1;
      std::operator+(&local_2780,&local_27a0,", \"detail::ileaveZeros_naive(input, 32)\"=");
      local_27c3 = 1;
      stringify<unsigned_long>(&local_27e8,local_2700);
      local_27e9 = 1;
      std::operator+(&local_2760,&local_2780,&local_27e8);
      local_27ea = 1;
      std::operator+(&local_2740,&local_2760,")");
      local_27eb = 1;
      local_2720 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2740);
      tl__18 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_2800 = "run";
      local_27f8 = 0xa1;
      loc_16.function = "run";
      loc_16.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_16.line = 0xa1;
      assertFail(local_2720,loc_16);
    }
    local_27c1 = 0;
    local_27c2 = 0;
    local_27c3 = 0;
    local_27e9 = 0;
    local_27ea = 0;
    local_27eb = 0;
    tr__18 = (uint64_t *)ileaveZeros_const<63u,0u>(tl_._4_4_);
    local_2810 = &tr__18;
    uStack_2828 = detail::ileaveZeros_naive(tl_._4_4_,0x3f);
    local_2820 = &stack0xffffffffffffd7d8;
    local_282c = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_2810,local_2820);
    local_28e1 = 0;
    local_28e2 = 0;
    local_28e3 = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_28e0,(unsigned_long *)local_2810);
      local_28e1 = 1;
      std::operator+(&local_28c0,
                     "Comparison failed: ileaveZeros_const<63>(input) == detail::ileaveZeros_naive(input, 63) (with \"ileaveZeros_const<63>(input)\"="
                     ,&local_28e0);
      local_28e2 = 1;
      std::operator+(&local_28a0,&local_28c0,", \"detail::ileaveZeros_naive(input, 63)\"=");
      local_28e3 = 1;
      stringify<unsigned_long>(&local_2908,local_2820);
      std::operator+(&local_2880,&local_28a0,&local_2908);
      std::operator+(&local_2860,&local_2880,")");
      local_2840 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2860);
      loc_17.function = "run";
      loc_17.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_17.line = 0xa2;
      assertFail(local_2840,loc_17);
    }
    local_28e1 = 0;
    local_28e2 = 0;
    local_28e3 = 0;
    uStack_13b0 = uStack_13b0 + 1;
  }
  stringify<unsigned_long>(&local_2460,(unsigned_long *)local_2390);
  local_2461 = 1;
  std::operator+(&local_2440,
                 "Comparison failed: ileaveZeros_const<15>(input) == detail::ileaveZeros_naive(input, 15) (with \"ileaveZeros_const<15>(input)\"="
                 ,&local_2460);
  local_2462 = 1;
  std::operator+(&local_2420,&local_2440,", \"detail::ileaveZeros_naive(input, 15)\"=");
  local_2463 = 1;
  stringify<unsigned_long>(&local_2488,local_23a0);
  local_2489 = 1;
  std::operator+(&local_2400,&local_2420,&local_2488);
  local_248a = 1;
  std::operator+(&local_23e0,&local_2400,")");
  local_248b = 1;
  local_23c0 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_23e0);
  tl__15 = (uint64_t *)anon_var_dwarf_a493;
  pcStack_24a0 = "run";
  local_2498 = 0x9e;
  loc_13.function = "run";
  loc_13.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc_13.line = 0x9e;
  assertFail(local_23c0,loc_13);
}

Assistant:

BITMANIP_TEST(bitileave, ileaveZeros_naive_matches_template)
{
    constexpr size_t iterations = 1024 * 8;

    std::mt19937 rng{12345};
    std::uniform_int_distribution<std::uint32_t> distr{0, std::numeric_limits<std::uint32_t>::max()};

    for (size_t i = 0; i < iterations; ++i) {
        const auto input = distr(rng);
        BITMANIP_ASSERT_EQ(ileaveZeros_const<1>(input), detail::ileaveZeros_naive(input, 1));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<2>(input), detail::ileaveZeros_naive(input, 2));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<3>(input), detail::ileaveZeros_naive(input, 3));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<4>(input), detail::ileaveZeros_naive(input, 4));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<5>(input), detail::ileaveZeros_naive(input, 5));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<6>(input), detail::ileaveZeros_naive(input, 6));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<7>(input), detail::ileaveZeros_naive(input, 7));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<8>(input), detail::ileaveZeros_naive(input, 8));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<9>(input), detail::ileaveZeros_naive(input, 9));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<10>(input), detail::ileaveZeros_naive(input, 10));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<11>(input), detail::ileaveZeros_naive(input, 11));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<12>(input), detail::ileaveZeros_naive(input, 12));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<13>(input), detail::ileaveZeros_naive(input, 13));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<14>(input), detail::ileaveZeros_naive(input, 14));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<15>(input), detail::ileaveZeros_naive(input, 15));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<16>(input), detail::ileaveZeros_naive(input, 16));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<16>(input), detail::ileaveZeros_naive(input, 16));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<32>(input), detail::ileaveZeros_naive(input, 32));
        BITMANIP_ASSERT_EQ(ileaveZeros_const<63>(input), detail::ileaveZeros_naive(input, 63));
    }
}